

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixRead(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  int iVar1;
  int cnt;
  int got;
  unixFile *pFile;
  unqlite_int64 offset_local;
  unqlite_int64 amt_local;
  void *pBuf_local;
  unqlite_file *id_local;
  
  cnt = (int)amt;
  iVar1 = seekAndRead((unixFile *)id,offset,pBuf,cnt);
  if (iVar1 == cnt) {
    id_local._4_4_ = 0;
  }
  else if (iVar1 < 0) {
    id_local._4_4_ = -2;
  }
  else {
    *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
    SyZero((void *)((long)pBuf + (long)iVar1),cnt - iVar1);
    id_local._4_4_ = -2;
  }
  return id_local._4_4_;
}

Assistant:

static int unixRead(
  unqlite_file *id, 
  void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  
  got = seekAndRead(pFile, offset, pBuf, (int)amt);
  if( got==(int)amt ){
    return UNQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return UNQLITE_IOERR;
  }else{
    pFile->lastErrno = 0; /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    SyZero(&((char*)pBuf)[got],(sxu32)amt-got);
    return UNQLITE_IOERR;
  }
}